

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessing.c
# Opt level: O0

Queue * make_define_argument_list(size_t number_of_arguments)

{
  Queue *ret;
  size_t i;
  size_t number_of_arguments_local;
  
  if (number_of_arguments == 0) {
    number_of_arguments_local = 0;
  }
  else {
    number_of_arguments_local = (size_t)malloc(number_of_arguments * 0x18);
    for (ret = (Queue *)0x0; ret < number_of_arguments; ret = (Queue *)((long)&ret->first + 1)) {
      Queue_Init((Queue *)(number_of_arguments_local + (long)ret * 0x18));
    }
  }
  return (Queue *)number_of_arguments_local;
}

Assistant:

struct Queue* make_define_argument_list(size_t number_of_arguments)
{
	size_t i;
	struct Queue *ret;

	if(number_of_arguments==0)
		return NULL;

	ret=malloc(sizeof(struct Queue)*number_of_arguments);

	for(i=0;i<number_of_arguments;++i)
	{
		Queue_Init(ret+i);
	}
	return ret;
}